

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

Vec4 __thiscall
tcu::ConstPixelBufferAccess::sample2DOffset
          (ConstPixelBufferAccess *this,Sampler *sampler,FilterMode filter,float s,float t,
          IVec3 *offset)

{
  WrapMode WVar1;
  FilterMode FVar2;
  WrapMode WVar3;
  bool bVar4;
  float afVar5 [4];
  undefined1 auVar6 [16];
  int i;
  WrapMode WVar7;
  WrapMode WVar8;
  FilterMode FVar9;
  FilterMode FVar10;
  FilterMode FVar11;
  TextureChannelClass TVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  undefined4 in_register_00000014;
  Sampler *pSVar16;
  Vector<float,_4> *res_18;
  byte bVar17;
  IVec3 *in_R8;
  WrapMode WVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 in_register_00001244 [12];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Vec4 VVar30;
  Vec4 VVar31;
  Vector<float,_4> res_15;
  Vec4 p11;
  Vec4 p01;
  Vec4 p10;
  Vec4 p00;
  Vector<float,_4> res_16;
  Vector<float,_4> res_17;
  Vector<float,_4> res_13;
  Vector<float,_4> res_14;
  Vector<float,_4> res_10;
  Vector<float,_4> res_11;
  Vector<float,_4> res_8;
  Vector<float,_4> res_9;
  Vector<float,_4> res_12;
  WrapMode local_184;
  undefined8 local_158;
  undefined8 uStack_150;
  Sampler *local_140;
  undefined1 local_138 [16];
  ulong local_120;
  FilterMode local_114;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [24];
  float afStack_c0 [2];
  void *local_b8;
  undefined8 uStack_b0;
  float local_a8 [4];
  undefined1 local_98 [16];
  float local_88 [22];
  Vec4 VVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  
  auVar28._4_12_ = in_register_00001244;
  auVar28._0_4_ = t;
  pSVar16 = (Sampler *)CONCAT44(in_register_00000014,filter);
  if (pSVar16->normalizedCoords == true) {
    WVar1 = pSVar16->wrapS;
    fVar24 = 0.0;
    if (WVar1 < WRAPMODE_LAST) {
      fVar24 = (float)(int)sampler->wrapR;
      if ((0x57U >> (WVar1 & 0x1f) & 1) == 0) {
        local_138 = auVar28;
        if (WVar1 == REPEAT_CL) {
          fVar25 = floorf(s);
          fVar24 = (s - fVar25) * fVar24;
          auVar28 = local_138;
        }
        else {
          fVar26 = s * 0.5;
          fVar25 = floorf(fVar26);
          fVar25 = fVar26 - fVar25;
          if ((fVar25 != 0.5) || (NAN(fVar25))) {
            fVar27 = floorf(fVar26 + 0.5);
          }
          else {
            fVar27 = 0.0;
            if (((long)(fVar26 - fVar25) & 1U) != 0) {
              fVar27 = 1.0;
            }
            fVar27 = (fVar26 - fVar25) + fVar27;
          }
          fVar25 = s - (fVar27 + fVar27);
          uVar23 = -(uint)(-fVar25 <= fVar25);
          fVar24 = (float)(~uVar23 & (uint)-fVar25 | (uint)fVar25 & uVar23) * fVar24;
          auVar28 = local_138;
        }
      }
      else {
        fVar24 = fVar24 * s;
      }
    }
    WVar1 = pSVar16->wrapT;
    fVar25 = auVar28._0_4_;
    s = fVar24;
    if (WVar1 < WRAPMODE_LAST) {
      fVar24 = (float)(int)sampler->minFilter;
      if ((0x57U >> (WVar1 & 0x1f) & 1) == 0) {
        local_138 = auVar28;
        if (WVar1 == REPEAT_CL) {
          fVar25 = floorf(fVar25);
          auVar28._4_12_ = local_138._4_12_;
          auVar28._0_4_ = (local_138._0_4_ - fVar25) * fVar24;
        }
        else {
          fVar25 = fVar25 * 0.5;
          fVar26 = floorf(fVar25);
          fVar26 = fVar25 - fVar26;
          if ((fVar26 != 0.5) || (NAN(fVar26))) {
            fVar27 = floorf(fVar25 + 0.5);
          }
          else {
            fVar27 = 0.0;
            if (((long)(fVar25 - fVar26) & 1U) != 0) {
              fVar27 = 1.0;
            }
            fVar27 = (fVar25 - fVar26) + fVar27;
          }
          fVar25 = (float)local_138._0_4_ - (fVar27 + fVar27);
          uVar23 = -(uint)(-fVar25 <= fVar25);
          auVar29._4_4_ = local_138._4_4_ & (local_138._4_4_ ^ 0x80000000);
          auVar29._0_4_ = (uint)fVar25 & uVar23;
          auVar29._8_4_ = local_138._8_4_ & (local_138._8_4_ ^ 0x80000000);
          auVar29._12_4_ = local_138._12_4_ & (local_138._12_4_ ^ 0x80000000);
          auVar29 = ZEXT416(~uVar23 & (uint)-fVar25) | auVar29;
          auVar28._4_12_ = auVar29._4_12_;
          auVar28._0_4_ = auVar29._0_4_ * fVar24;
        }
      }
      else {
        auVar28._0_4_ = fVar25 * fVar24;
      }
    }
    else {
      auVar28 = ZEXT816(0);
    }
  }
  if ((int)offset == 0) {
    VVar30 = sampleNearest2D((tcu *)this,(ConstPixelBufferAccess *)sampler,pSVar16,s,auVar28._0_4_,
                             in_R8);
    VVar30.m_data[0] = VVar30.m_data[0];
    VVar31.m_data[1] = VVar30.m_data[1];
    register0x00001240 = VVar30.m_data[2];
    register0x00001244 = VVar30.m_data[3];
    return (Vec4)VVar30.m_data;
  }
  if ((int)offset != 1) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = auVar28._0_8_;
    afVar5 = (float  [4])(auVar6 << 0x40);
    (this->m_format).order = R;
    (this->m_format).type = SNORM_INT8;
    (this->m_size).m_data[0] = 0;
    (this->m_size).m_data[1] = 0;
    VVar32.m_data[0] = afVar5[0];
    VVar31.m_data[1] = afVar5[1];
    register0x00001240 = afVar5[2];
    register0x00001244 = afVar5[3];
    return (Vec4)VVar32.m_data;
  }
  WVar1 = sampler->wrapR;
  FVar2 = sampler->minFilter;
  local_138 = auVar28;
  fVar25 = floorf(s + -0.5);
  iVar15 = in_R8->m_data[0];
  local_120 = (ulong)(uint)in_R8->m_data[1];
  local_138._0_4_ = (float)local_138._0_4_ + -0.5;
  fVar24 = floorf((float)local_138._0_4_);
  WVar3 = pSVar16->wrapS;
  local_184 = CLAMP_TO_EDGE;
  WVar18 = CLAMP_TO_EDGE;
  if (WVar3 < WRAPMODE_LAST) {
    WVar8 = iVar15 + (int)fVar25;
    WVar18 = WVar8;
    switch(WVar3) {
    default:
      WVar7 = WVar1 - CLAMP_TO_BORDER;
      if ((int)WVar8 < (int)(WVar1 - CLAMP_TO_BORDER)) {
        WVar7 = WVar8;
      }
      WVar18 = CLAMP_TO_EDGE;
      if (-1 < (int)WVar8) {
        WVar18 = WVar7;
      }
      break;
    case CLAMP_TO_BORDER:
      WVar7 = WVar1;
      if ((int)WVar8 < (int)WVar1) {
        WVar7 = WVar8;
      }
      WVar18 = ~CLAMP_TO_EDGE;
      if (-2 < (int)WVar8) {
        WVar18 = WVar7;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      WVar18 = ((int)WVar8 % (int)WVar1 >> 0x1f & WVar1) + (int)WVar8 % (int)WVar1;
      break;
    case MIRRORED_ONCE:
      WVar18 = WVar1;
      if ((int)WVar8 < (int)WVar1) {
        WVar18 = WVar8;
      }
      if (SBORROW4(WVar8,-WVar1) != (int)(WVar8 + WVar1) < 0) {
        WVar18 = -WVar1;
      }
    case MIRRORED_REPEAT_GL:
      iVar14 = (int)WVar18 % (int)(WVar1 * 2);
      uVar23 = (iVar14 - WVar1) + (iVar14 >> 0x1f & WVar1 * 2);
      WVar18 = ~((int)uVar23 >> 0x1f ^ uVar23) + WVar1;
    }
  }
  if (WVar3 < WRAPMODE_LAST) {
    WVar7 = iVar15 + (int)fVar25 + CLAMP_TO_BORDER;
    WVar8 = WVar7;
    switch(WVar3) {
    default:
      WVar8 = WVar1 - CLAMP_TO_BORDER;
      if ((int)WVar7 < (int)(WVar1 - CLAMP_TO_BORDER)) {
        WVar8 = WVar7;
      }
      local_184 = CLAMP_TO_EDGE;
      if (-1 < (int)WVar7) {
        local_184 = WVar8;
      }
      break;
    case CLAMP_TO_BORDER:
      WVar8 = WVar1;
      if ((int)WVar7 < (int)WVar1) {
        WVar8 = WVar7;
      }
      local_184 = ~CLAMP_TO_EDGE;
      if (-2 < (int)WVar7) {
        local_184 = WVar8;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      local_184 = ((int)WVar7 % (int)WVar1 >> 0x1f & WVar1) + (int)WVar7 % (int)WVar1;
      break;
    case MIRRORED_ONCE:
      WVar8 = WVar1;
      if ((int)WVar7 < (int)WVar1) {
        WVar8 = WVar7;
      }
      if (SBORROW4(WVar7,-WVar1) != (int)(WVar7 + WVar1) < 0) {
        WVar8 = -WVar1;
      }
    case MIRRORED_REPEAT_GL:
      iVar15 = (int)WVar8 % (int)(WVar1 * 2);
      uVar23 = (iVar15 - WVar1) + (iVar15 >> 0x1f & WVar1 * 2);
      local_184 = ~((int)uVar23 >> 0x1f ^ uVar23) + WVar1;
    }
  }
  WVar8 = pSVar16->wrapT;
  FVar10 = NEAREST;
  if (WVar8 < WRAPMODE_LAST) {
    FVar9 = (int)local_120 + (int)fVar24;
    FVar10 = FVar9;
    switch(WVar8) {
    default:
      FVar11 = FVar2 - LINEAR;
      if ((int)FVar9 < (int)(FVar2 - LINEAR)) {
        FVar11 = FVar9;
      }
      FVar10 = NEAREST;
      if (-1 < (int)FVar9) {
        FVar10 = FVar11;
      }
      break;
    case CLAMP_TO_BORDER:
      FVar11 = FVar2;
      if ((int)FVar9 < (int)FVar2) {
        FVar11 = FVar9;
      }
      FVar10 = ~NEAREST;
      if (-2 < (int)FVar9) {
        FVar10 = FVar11;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      FVar10 = ((int)FVar9 % (int)FVar2 >> 0x1f & FVar2) + (int)FVar9 % (int)FVar2;
      break;
    case MIRRORED_ONCE:
      FVar10 = FVar2;
      if ((int)FVar9 < (int)FVar2) {
        FVar10 = FVar9;
      }
      if (SBORROW4(FVar9,-FVar2) != (int)(FVar9 + FVar2) < 0) {
        FVar10 = -FVar2;
      }
    case MIRRORED_REPEAT_GL:
      iVar15 = (int)FVar10 % (int)(FVar2 * 2);
      uVar23 = (iVar15 - FVar2) + (iVar15 >> 0x1f & FVar2 * 2);
      FVar10 = ~((int)uVar23 >> 0x1f ^ uVar23) + FVar2;
    }
  }
  local_114 = NEAREST;
  if (WVar8 < WRAPMODE_LAST) {
    FVar11 = (int)local_120 + (int)fVar24 + LINEAR;
    FVar9 = FVar11;
    switch(WVar8) {
    default:
      FVar9 = FVar2 - LINEAR;
      if ((int)FVar11 < (int)(FVar2 - LINEAR)) {
        FVar9 = FVar11;
      }
      local_114 = NEAREST;
      if (-1 < (int)FVar11) {
        local_114 = FVar9;
      }
      break;
    case CLAMP_TO_BORDER:
      FVar9 = FVar2;
      if ((int)FVar11 < (int)FVar2) {
        FVar9 = FVar11;
      }
      local_114 = ~NEAREST;
      if (-2 < (int)FVar11) {
        local_114 = FVar9;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      local_114 = ((int)FVar11 % (int)FVar2 >> 0x1f & FVar2) + (int)FVar11 % (int)FVar2;
      break;
    case MIRRORED_ONCE:
      FVar9 = FVar2;
      if ((int)FVar11 < (int)FVar2) {
        FVar9 = FVar11;
      }
      if (SBORROW4(FVar11,-FVar2) != (int)(FVar11 + FVar2) < 0) {
        FVar9 = -FVar2;
      }
    case MIRRORED_REPEAT_GL:
      iVar15 = (int)FVar9 % (int)(FVar2 * 2);
      uVar23 = (iVar15 - FVar2) + (iVar15 >> 0x1f & FVar2 * 2);
      local_114 = ~((int)uVar23 >> 0x1f ^ uVar23) + FVar2;
    }
  }
  bVar20 = WVar3 == CLAMP_TO_BORDER;
  bVar19 = ((int)WVar1 <= (int)WVar18 || (int)WVar18 < 0) && bVar20;
  bVar21 = WVar8 == CLAMP_TO_BORDER;
  local_120 = CONCAT71(local_120._1_7_,bVar21);
  bVar22 = (int)local_114 < 0;
  bVar4 = (int)FVar2 <= (int)local_114;
  iVar15 = (int)sampler;
  local_140 = pSVar16;
  if ((bVar19) || (((int)FVar2 <= (int)FVar10 || (int)FVar10 < 0) && bVar21)) {
    TVar12 = getTextureChannelClass(sampler->wrapT);
    switch(TVar12) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((tcu *)local_d8,(TextureFormat *)sampler,local_140);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>((tcu *)&local_158,(TextureFormat *)sampler,local_140);
      local_d8._0_4_ = R;
      local_d8._4_4_ = SNORM_INT8;
      local_d8._8_4_ = 0;
      local_d8._12_4_ = 0;
      lVar13 = 0;
      do {
        *(float *)(local_d8 + lVar13 * 4) = (float)*(int *)((long)&local_158 + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>((tcu *)&local_158,(TextureFormat *)sampler,local_140);
      local_d8._0_4_ = R;
      local_d8._4_4_ = SNORM_INT8;
      local_d8._8_4_ = 0;
      local_d8._12_4_ = 0;
      lVar13 = 0;
      do {
        *(float *)(local_d8 + lVar13 * 4) = (float)*(uint *)((long)&local_158 + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      break;
    default:
      lVar13 = 0;
      do {
        *(undefined4 *)(local_d8 + lVar13 * 4) = 0xbf800000;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
    }
  }
  else {
    lookup((ConstPixelBufferAccess *)local_d8,iVar15,WVar18,FVar10);
  }
  local_120 = CONCAT71(local_120._1_7_,(byte)local_120 & (bVar4 || bVar22));
  if (((int)FVar2 <= (int)FVar10 || (int)FVar10 < 0) && bVar21 ||
      ((int)WVar1 <= (int)local_184 || (int)local_184 < 0) && bVar20) {
    TVar12 = getTextureChannelClass(sampler->wrapT);
    bVar17 = (byte)local_120;
    switch(TVar12) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((tcu *)local_e8,(TextureFormat *)sampler,local_140);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>((tcu *)&local_158,(TextureFormat *)sampler,local_140);
      local_e8._0_4_ = R;
      local_e8._4_4_ = SNORM_INT8;
      local_e8._8_4_ = 0;
      local_e8._12_4_ = 0;
      lVar13 = 0;
      do {
        *(float *)(local_e8 + lVar13 * 4) = (float)*(int *)((long)&local_158 + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>((tcu *)&local_158,(TextureFormat *)sampler,local_140);
      local_e8._0_4_ = R;
      local_e8._4_4_ = SNORM_INT8;
      local_e8._8_4_ = 0;
      local_e8._12_4_ = 0;
      lVar13 = 0;
      do {
        *(float *)(local_e8 + lVar13 * 4) = (float)*(uint *)((long)&local_158 + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      break;
    default:
      lVar13 = 0;
      do {
        *(undefined4 *)(local_e8 + lVar13 * 4) = 0xbf800000;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
    }
  }
  else {
    lookup((ConstPixelBufferAccess *)local_e8,iVar15,local_184,FVar10);
    bVar17 = (byte)local_120;
  }
  if ((bVar19 | bVar17) == 1) {
    TVar12 = getTextureChannelClass(sampler->wrapT);
    pSVar16 = local_140;
    switch(TVar12) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((tcu *)local_f8,(TextureFormat *)sampler,local_140);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>((tcu *)&local_158,(TextureFormat *)sampler,local_140);
      local_f8._0_4_ = R;
      local_f8._4_4_ = SNORM_INT8;
      local_f8._8_4_ = 0;
      local_f8._12_4_ = 0;
      lVar13 = 0;
      do {
        *(float *)(local_f8 + lVar13 * 4) = (float)*(int *)((long)&local_158 + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>((tcu *)&local_158,(TextureFormat *)sampler,local_140);
      local_f8._0_4_ = R;
      local_f8._4_4_ = SNORM_INT8;
      local_f8._8_4_ = 0;
      local_f8._12_4_ = 0;
      lVar13 = 0;
      do {
        *(float *)(local_f8 + lVar13 * 4) = (float)*(uint *)((long)&local_158 + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      break;
    default:
      lVar13 = 0;
      do {
        *(undefined4 *)(local_f8 + lVar13 * 4) = 0xbf800000;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
    }
  }
  else {
    lookup((ConstPixelBufferAccess *)local_f8,iVar15,WVar18,local_114);
    pSVar16 = local_140;
  }
  fVar25 = (s + -0.5) - fVar25;
  if (((((int)WVar1 <= (int)local_184 || (int)local_184 < 0) && bVar20) | bVar17) == 1) {
    TVar12 = getTextureChannelClass(sampler->wrapT);
    switch(TVar12) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((tcu *)local_108,(TextureFormat *)sampler,pSVar16);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>((tcu *)&local_158,(TextureFormat *)sampler,pSVar16);
      local_108._0_4_ = R;
      local_108._4_4_ = SNORM_INT8;
      local_108._8_4_ = 0;
      local_108._12_4_ = 0;
      lVar13 = 0;
      do {
        *(float *)(local_108 + lVar13 * 4) = (float)*(int *)((long)&local_158 + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>((tcu *)&local_158,(TextureFormat *)sampler,pSVar16);
      local_108._0_4_ = R;
      local_108._4_4_ = SNORM_INT8;
      local_108._8_4_ = 0;
      local_108._12_4_ = 0;
      lVar13 = 0;
      do {
        *(float *)(local_108 + lVar13 * 4) = (float)*(uint *)((long)&local_158 + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      break;
    default:
      lVar13 = 0;
      do {
        *(undefined4 *)(local_108 + lVar13 * 4) = 0xbf800000;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      goto LAB_00a59d1b;
    }
  }
  else {
    lookup((ConstPixelBufferAccess *)local_108,iVar15,local_184,local_114);
  }
LAB_00a59d1b:
  local_138._0_4_ = (float)local_138._0_4_ - fVar24;
  local_88[8] = 0.0;
  local_88[9] = 0.0;
  local_88[10] = 0.0;
  local_88[0xb] = 0.0;
  lVar13 = 0;
  do {
    local_88[lVar13 + 8] = *(float *)(local_d8 + lVar13 * 4) * (1.0 - fVar25);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  local_88[0xc] = 0.0;
  local_88[0xd] = 0.0;
  local_88[0xe] = 0.0;
  local_88[0xf] = 0.0;
  lVar13 = 0;
  do {
    local_88[lVar13 + 0xc] = local_88[lVar13 + 8] * (1.0 - (float)local_138._0_4_);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  local_88[3] = 0.0;
  lVar13 = 0;
  do {
    local_88[lVar13] = *(float *)(local_e8 + lVar13 * 4) * fVar25;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  local_88[4] = 0.0;
  local_88[5] = 0.0;
  local_88[6] = 0.0;
  local_88[7] = 0.0;
  lVar13 = 0;
  do {
    local_88[lVar13 + 4] = local_88[lVar13] * (1.0 - (float)local_138._0_4_);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  local_88[0x10] = 0.0;
  local_88[0x11] = 0.0;
  local_88[0x12] = 0.0;
  local_88[0x13] = 0.0;
  lVar13 = 0;
  do {
    local_88[lVar13 + 0x10] = local_88[lVar13 + 0xc] + local_88[lVar13 + 4];
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  local_a8[3] = 0.0;
  lVar13 = 0;
  do {
    fVar24 = *(float *)(local_f8 + lVar13 * 4) * (1.0 - fVar25);
    local_a8[lVar13] = fVar24;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  local_98._0_12_ = ZEXT812(0);
  local_98._12_4_ = 0;
  lVar13 = 0;
  do {
    *(float *)(local_98 + lVar13 * 4) = local_a8[lVar13] * (float)local_138._0_4_;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  local_158 = 0;
  uStack_150 = 0;
  lVar13 = 0;
  do {
    *(float *)((long)&local_158 + lVar13 * 4) =
         local_88[lVar13 + 0x10] + *(float *)(local_98 + lVar13 * 4);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  local_d8._16_8_ = (void *)0x0;
  afStack_c0[0] = 0.0;
  afStack_c0[1] = 0.0;
  lVar13 = 0;
  do {
    afStack_c0[lVar13 + -2] = *(float *)(local_108 + lVar13 * 4) * fVar25;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  local_b8 = (void *)0x0;
  uStack_b0 = 0;
  lVar13 = 0;
  do {
    *(float *)((long)&local_b8 + lVar13 * 4) = afStack_c0[lVar13 + -2] * (float)local_138._0_4_;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  (this->m_format).order = R;
  (this->m_format).type = SNORM_INT8;
  (this->m_size).m_data[0] = 0;
  (this->m_size).m_data[1] = 0;
  lVar13 = 0;
  do {
    fVar25 = *(float *)((long)&local_158 + lVar13 * 4) + *(float *)((long)&local_b8 + lVar13 * 4);
    (this->m_size).m_data[lVar13 + -2] = (int)fVar25;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  VVar31.m_data[0] = fVar25;
  VVar31.m_data[1] = 0.0;
  register0x00001240 = fVar24;
  register0x00001244 = 0.0;
  return (Vec4)VVar31.m_data;
}

Assistant:

Vec4 ConstPixelBufferAccess::sample2DOffset (const Sampler& sampler, Sampler::FilterMode filter, float s, float t, const IVec3& offset) const
{
	// check selected layer exists
	// \note offset.xy is the XY offset, offset.z is the selected layer
	DE_ASSERT(de::inBounds(offset.z(), 0, m_size.z()));

	// Non-normalized coordinates.
	float u = s;
	float v = t;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, s, m_size.x());
		v = unnormalize(sampler.wrapT, t, m_size.y());
	}

	switch (filter)
	{
		case Sampler::NEAREST:	return sampleNearest2D	(*this, sampler, u, v, offset);
		case Sampler::LINEAR:	return sampleLinear2D	(*this, sampler, u, v, offset);
		default:
			DE_ASSERT(DE_FALSE);
			return Vec4(0.0f);
	}
}